

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O2

void __thiscall adios2::format::BPBase::DeleteBuffers(BPBase *this)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"buffering",&local_61);
  profiling::IOChrono::Start(&this->m_Profiler,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  BufferSTL::Delete(&this->m_Data);
  BufferSTL::Delete(&this->m_Metadata);
  std::__cxx11::string::string((string *)&local_60,"buffering",&local_61);
  profiling::IOChrono::Stop(&this->m_Profiler,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void BPBase::DeleteBuffers()
{
    m_Profiler.Start("buffering");
    m_Data.Delete();
    m_Metadata.Delete();
    m_Profiler.Stop("buffering");
}